

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

char * uloc_getISO3Country_63(char *localeID)

{
  ushort uVar1;
  char *pcVar2;
  UErrorCode err;
  char cntry [12];
  
  err = U_ZERO_ERROR;
  if (localeID == (char *)0x0) {
    localeID = locale_get_default_63();
  }
  uloc_getCountry_63(localeID,cntry,0xc,&err);
  pcVar2 = "";
  if (err < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = _findIndex(COUNTRIES,cntry);
    if (-1 < (short)uVar1) {
      pcVar2 = COUNTRIES_3[uVar1];
    }
  }
  return pcVar2;
}

Assistant:

U_CAPI const char*  U_EXPORT2
uloc_getISO3Country(const char* localeID)
{
    int16_t offset;
    char cntry[ULOC_LANG_CAPACITY];
    UErrorCode err = U_ZERO_ERROR;

    if (localeID == NULL)
    {
        localeID = uloc_getDefault();
    }
    uloc_getCountry(localeID, cntry, ULOC_LANG_CAPACITY, &err);
    if (U_FAILURE(err))
        return "";
    offset = _findIndex(COUNTRIES, cntry);
    if (offset < 0)
        return "";

    return COUNTRIES_3[offset];
}